

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

void __thiscall agr::savebuf::savebuf(savebuf *this,streambuf *sbuf)

{
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__savebuf_00104d30;
  this->sbuf = sbuf;
  (this->save)._M_dataplus._M_p = (pointer)&(this->save).field_2;
  (this->save)._M_string_length = 0;
  (this->save).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

savebuf::savebuf( std::streambuf* sbuf ): 
   sbuf( sbuf ) 
   {}